

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_detach(DETACH_HANDLE detach)

{
  DETACH_INSTANCE *detach_instance;
  AMQP_VALUE result;
  DETACH_HANDLE detach_local;
  
  if (detach == (DETACH_HANDLE)0x0) {
    detach_instance = (DETACH_INSTANCE *)0x0;
  }
  else {
    detach_instance = (DETACH_INSTANCE *)amqpvalue_clone(detach->composite_value);
  }
  return (AMQP_VALUE)detach_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_detach(DETACH_HANDLE detach)
{
    AMQP_VALUE result;

    if (detach == NULL)
    {
        result = NULL;
    }
    else
    {
        DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)detach;
        result = amqpvalue_clone(detach_instance->composite_value);
    }

    return result;
}